

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::setQPDFOptions(QPDFJob *this,QPDF *pdf)

{
  element_type *peVar1;
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)
             (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  QPDF::setLogger(pdf,(shared_ptr<QPDFLogger> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->ignore_xref_streams == true) {
    QPDF::setIgnoreXRefStreams(pdf,true);
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar1->suppress_recovery == true) {
    QPDF::setAttemptRecovery(pdf,false);
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar1->password_is_hex_key == true) {
    QPDF::setPasswordIsHexKey(pdf,true);
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar1->suppress_warnings == true) {
    QPDF::setSuppressWarnings(pdf,true);
  }
  return;
}

Assistant:

void
QPDFJob::setQPDFOptions(QPDF& pdf)
{
    pdf.setLogger(m->log);
    if (m->ignore_xref_streams) {
        pdf.setIgnoreXRefStreams(true);
    }
    if (m->suppress_recovery) {
        pdf.setAttemptRecovery(false);
    }
    if (m->password_is_hex_key) {
        pdf.setPasswordIsHexKey(true);
    }
    if (m->suppress_warnings) {
        pdf.setSuppressWarnings(true);
    }
}